

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall UnitTestBase::UnitTestBase(UnitTestBase *this)

{
  UnitTestManager *this_00;
  
  this->_vptr_UnitTestBase = (_func_int **)&PTR___cxa_pure_virtual_001969d8;
  (this->test_name_)._M_dataplus._M_p = (pointer)&(this->test_name_).field_2;
  (this->test_name_)._M_string_length = 0;
  (this->test_name_).field_2._M_local_buf[0] = '\0';
  (this->errors_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->errors_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->errors_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = UnitTestManager::GetInstance();
  UnitTestManager::AddUnitTest(this_00,this);
  return;
}

Assistant:

UnitTestBase::UnitTestBase()
{
    UnitTestManager::GetInstance().AddUnitTest(this);
}